

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Diag
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t c;
  long lVar2;
  int64_t r;
  long lVar3;
  undefined8 local_98 [4];
  complex<long_double> __r;
  complex<long_double> pivot;
  
  lVar3 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar3 != CONCAT44(extraout_var,iVar1)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  lVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar1) <= lVar3) break;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&pivot,this,lVar3,lVar3);
    for (lVar2 = 0;
        lVar2 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
        lVar2 = lVar2 + 1) {
      (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(local_98,B,lVar3,lVar2);
      __r._M_value._16_8_ = local_98[2];
      __r._M_value._24_8_ = local_98[3];
      __r._M_value._0_8_ = local_98[0];
      __r._M_value._8_8_ = local_98[1];
      std::complex<long_double>::operator/=(&__r,&pivot);
      (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(B,lVar3,lVar2,&__r);
    }
    lVar3 = lVar3 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}